

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O3

void * asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                 (undefined8 *param_1,long param_2)

{
  ulong uVar1;
  void *pointer;
  byte *pbVar2;
  byte bVar3;
  
  uVar1 = param_2 + 3;
  if ((param_1 != (undefined8 *)0x0) && (pbVar2 = (byte *)*param_1, pbVar2 != (byte *)0x0)) {
    *param_1 = 0;
    bVar3 = *pbVar2;
    if (uVar1 >> 2 <= (ulong)bVar3) goto LAB_0010a19c;
    operator_delete(pbVar2);
  }
  pbVar2 = (byte *)operator_new((uVar1 & 0xfffffffffffffffc) + 1);
  bVar3 = (byte)(uVar1 >> 2);
  if (0x3ff < uVar1) {
    bVar3 = 0;
  }
LAB_0010a19c:
  pbVar2[param_2] = bVar3;
  return pbVar2;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread && this_thread->reusable_memory_[Purpose::mem_index])
    {
      void* const pointer = this_thread->reusable_memory_[Purpose::mem_index];
      this_thread->reusable_memory_[Purpose::mem_index] = 0;

      unsigned char* const mem = static_cast<unsigned char*>(pointer);
      if (static_cast<std::size_t>(mem[0]) >= chunks)
      {
        mem[size] = mem[0];
        return pointer;
      }

      ::operator delete(pointer);
    }

    void* const pointer = ::operator new(chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }